

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  opj_tcd_cblk_dec_t *cblk_00;
  int *piVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  OPJ_BOOL OVar12;
  OPJ_INT32 *pOVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  float local_2b4;
  float *local_2b0;
  float *pfStack_2a0;
  OPJ_FLOAT32 tmp_2;
  OPJ_FLOAT32 *tiledp2;
  OPJ_FLOAT32 *tiledp_1;
  OPJ_INT32 tmp_1;
  OPJ_INT32 tmp3;
  OPJ_INT32 tmp2;
  OPJ_INT32 tmp1;
  OPJ_INT32 tmp0;
  OPJ_INT32 *tiledp;
  OPJ_FLOAT32 tmp;
  __m128 xmm3_data;
  __m128 xmm2_data;
  __m128 xmm1_data;
  __m128 xmm0_data;
  __m128 xmm_stepsize;
  OPJ_UINT32 cblk_size;
  OPJ_INT32 mag;
  OPJ_INT32 val;
  OPJ_INT32 thresh;
  opj_tcd_resolution_t *pres_1;
  opj_tcd_resolution_t *pres;
  OPJ_UINT32 tile_w;
  OPJ_UINT32 resno;
  opj_t1_t *t1;
  opj_t1_cblk_decode_processing_job_t *job;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_INT32 y;
  OPJ_INT32 x;
  OPJ_UINT32 cblk_h;
  OPJ_UINT32 cblk_w;
  OPJ_INT32 *datap;
  opj_tccp_t *tccp;
  opj_tcd_tilecomp_t *tilec;
  opj_tcd_band_t *band;
  opj_tcd_cblk_dec_t *cblk;
  opj_tls_t *tls_local;
  void *user_data_local;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  
  cblk_00 = *(opj_tcd_cblk_dec_t **)((long)user_data + 8);
  if (*user_data == 0) {
    uVar10 = cblk_00->x1 - cblk_00->x0;
    uVar11 = cblk_00->y1 - cblk_00->y0;
    pOVar13 = (OPJ_INT32 *)opj_aligned_malloc((ulong)uVar10 * 4 * (ulong)uVar11);
    cblk_00->decoded_data = pOVar13;
    if (cblk_00->decoded_data == (OPJ_INT32 *)0x0) {
      if (*(long *)((long)user_data + 0x40) != 0) {
        opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
      }
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Cannot allocate cblk->decoded_data\n");
      if (*(long *)((long)user_data + 0x40) != 0) {
        opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
      }
      **(undefined4 **)((long)user_data + 0x30) = 0;
      opj_free(user_data);
      return;
    }
    memset(cblk_00->decoded_data,0,(ulong)uVar10 * 4 * (ulong)uVar11);
  }
  else if (cblk_00->decoded_data != (OPJ_INT32 *)0x0) {
    opj_aligned_free(cblk_00->decoded_data);
    cblk_00->decoded_data = (OPJ_INT32 *)0x0;
  }
  iVar2 = *(int *)((long)user_data + 4);
  piVar7 = *(int **)((long)user_data + 0x10);
  lVar16 = *(long *)((long)user_data + 0x18);
  lVar8 = *(long *)((long)user_data + 0x20);
  uVar10 = *(int *)(*(long *)(lVar16 + 0x20) + (ulong)(*(int *)(lVar16 + 0x18) - 1) * 0xc0 + 8) -
           *(int *)(*(long *)(lVar16 + 0x20) + (ulong)(*(int *)(lVar16 + 0x18) - 1) * 0xc0);
  if (**(int **)((long)user_data + 0x30) == 0) {
    opj_free(user_data);
  }
  else {
    _tile_w = (opj_t1_t *)opj_tls_get(tls,0);
    if (_tile_w == (opj_t1_t *)0x0) {
      _tile_w = opj_t1_create(0);
      opj_tls_set(tls,0,_tile_w,opj_t1_destroy_wrapper);
    }
    _tile_w->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
    OVar12 = opj_t1_decode_cblk(_tile_w,cblk_00,piVar7[4],*(OPJ_UINT32 *)(lVar8 + 0x328),
                                *(OPJ_UINT32 *)(lVar8 + 0x10),
                                *(opj_event_mgr_t **)((long)user_data + 0x38),
                                *(opj_mutex_t **)((long)user_data + 0x40),
                                *(OPJ_BOOL *)((long)user_data + 0x48));
    if (OVar12 == 0) {
      **(undefined4 **)((long)user_data + 0x30) = 0;
      opj_free(user_data);
    }
    else {
      i = cblk_00->x0 - *piVar7;
      j = cblk_00->y0 - piVar7[1];
      if ((piVar7[4] & 1U) != 0) {
        piVar14 = (int *)(*(long *)(lVar16 + 0x20) + (ulong)(iVar2 - 1) * 0xc0);
        i = (piVar14[2] - *piVar14) + i;
      }
      if ((piVar7[4] & 2U) != 0) {
        lVar15 = *(long *)(lVar16 + 0x20) + (ulong)(iVar2 - 1) * 0xc0;
        j = (*(int *)(lVar15 + 0xc) - *(int *)(lVar15 + 4)) + j;
      }
      if (cblk_00->decoded_data == (OPJ_INT32 *)0x0) {
        local_2b0 = (float *)_tile_w->data;
      }
      else {
        local_2b0 = (float *)cblk_00->decoded_data;
      }
      _cblk_h = local_2b0;
      uVar11 = _tile_w->w;
      uVar3 = _tile_w->h;
      if (*(int *)(lVar8 + 0x328) != 0) {
        if (*(int *)(lVar8 + 0x328) < 0x1f) {
          uVar4 = *(undefined4 *)(lVar8 + 0x328);
          for (job._0_4_ = 0; (uint)job < uVar3; job._0_4_ = (uint)job + 1) {
            for (job._4_4_ = 0; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
              fVar1 = local_2b0[(uint)job * uVar11 + job._4_4_];
              local_2b4 = fVar1;
              if ((int)fVar1 < 1) {
                local_2b4 = (float)-(int)fVar1;
              }
              if (1 << ((byte)uVar4 & 0x1f) <= (int)local_2b4) {
                bVar9 = (byte)*(undefined4 *)(lVar8 + 0x328) & 0x1f;
                local_2b4 = (float)((int)local_2b4 >> bVar9);
                if ((int)fVar1 < 0) {
                  local_2b4 = (float)((0 >> bVar9) - (int)local_2b4);
                }
                local_2b0[(uint)job * uVar11 + job._4_4_] = local_2b4;
              }
            }
          }
        }
        else {
          for (job._0_4_ = 0; (uint)job < uVar3; job._0_4_ = (uint)job + 1) {
            for (job._4_4_ = 0; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
              local_2b0[(uint)job * uVar11 + job._4_4_] = 0.0;
            }
          }
        }
      }
      if ((cblk_00->decoded_data == (OPJ_INT32 *)0x0) && (*(long *)(lVar16 + 0x30) == 0)) {
        __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                      ,0x6b7,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
      }
      if (cblk_00->decoded_data == (OPJ_INT32 *)0x0) {
        if (*(int *)(lVar8 + 0x14) == 1) {
          lVar16 = *(long *)(lVar16 + 0x30) + ((long)(int)j * (ulong)uVar10 + (long)(int)i) * 4;
          for (job._0_4_ = 0; (uint)job < uVar3; job._0_4_ = (uint)job + 1) {
            for (job._4_4_ = 0; job._4_4_ < (uVar11 & 0xfffffffc); job._4_4_ = job._4_4_ + 4) {
              fVar1 = local_2b0[(uint)job * uVar11 + job._4_4_ + 1];
              fVar5 = local_2b0[(uint)job * uVar11 + job._4_4_ + 2];
              fVar6 = local_2b0[(uint)job * uVar11 + job._4_4_ + 3];
              *(int *)(lVar16 + ((ulong)(uint)job * (ulong)uVar10 + (ulong)job._4_4_) * 4) =
                   (int)local_2b0[(uint)job * uVar11 + job._4_4_] / 2;
              *(int *)(lVar16 + 4 + ((ulong)(uint)job * (ulong)uVar10 + (ulong)job._4_4_) * 4) =
                   (int)fVar1 / 2;
              *(int *)(lVar16 + 8 + ((ulong)(uint)job * (ulong)uVar10 + (ulong)job._4_4_) * 4) =
                   (int)fVar5 / 2;
              *(int *)(lVar16 + 0xc + ((ulong)(uint)job * (ulong)uVar10 + (ulong)job._4_4_) * 4) =
                   (int)fVar6 / 2;
            }
            for (; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
              *(int *)(lVar16 + ((ulong)(uint)job * (ulong)uVar10 + (ulong)job._4_4_) * 4) =
                   (int)local_2b0[(uint)job * uVar11 + job._4_4_] / 2;
            }
          }
        }
        else {
          tiledp2 = (OPJ_FLOAT32 *)
                    (*(long *)(lVar16 + 0x30) + ((long)(int)j * (ulong)uVar10 + (long)(int)i) * 4);
          for (job._0_4_ = 0; (uint)job < uVar3; job._0_4_ = (uint)job + 1) {
            pfStack_2a0 = (float *)tiledp2;
            for (job._4_4_ = 0; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
              *pfStack_2a0 = (float)(int)*_cblk_h * (float)piVar7[10];
              _cblk_h = _cblk_h + 1;
              pfStack_2a0 = pfStack_2a0 + 1;
            }
            tiledp2 = tiledp2 + uVar10;
          }
        }
      }
      else {
        uVar11 = uVar11 * uVar3;
        if (*(int *)(lVar8 + 0x14) == 1) {
          for (job._4_4_ = 0; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
            local_2b0[job._4_4_] = (float)((int)local_2b0[job._4_4_] / 2);
          }
        }
        else {
          job._4_4_ = 0;
          fVar1 = (float)piVar7[10];
          for (; job._4_4_ < (uVar11 & 0xfffffff0); job._4_4_ = job._4_4_ + 0x10) {
            local_138 = (int)*(undefined8 *)_cblk_h;
            iStack_134 = (int)((ulong)*(undefined8 *)_cblk_h >> 0x20);
            iStack_130 = (int)*(undefined8 *)(_cblk_h + 2);
            iStack_12c = (int)((ulong)*(undefined8 *)(_cblk_h + 2) >> 0x20);
            local_148 = (int)*(undefined8 *)(_cblk_h + 4);
            iStack_144 = (int)((ulong)*(undefined8 *)(_cblk_h + 4) >> 0x20);
            iStack_140 = (int)*(undefined8 *)(_cblk_h + 6);
            iStack_13c = (int)((ulong)*(undefined8 *)(_cblk_h + 6) >> 0x20);
            local_158 = (int)*(undefined8 *)(_cblk_h + 8);
            iStack_154 = (int)((ulong)*(undefined8 *)(_cblk_h + 8) >> 0x20);
            iStack_150 = (int)*(undefined8 *)(_cblk_h + 10);
            iStack_14c = (int)((ulong)*(undefined8 *)(_cblk_h + 10) >> 0x20);
            local_168 = (int)*(undefined8 *)(_cblk_h + 0xc);
            iStack_164 = (int)((ulong)*(undefined8 *)(_cblk_h + 0xc) >> 0x20);
            iStack_160 = (int)*(undefined8 *)(_cblk_h + 0xe);
            iStack_15c = (int)((ulong)*(undefined8 *)(_cblk_h + 0xe) >> 0x20);
            *(ulong *)_cblk_h = CONCAT44((float)iStack_134 * fVar1,(float)local_138 * fVar1);
            *(ulong *)(_cblk_h + 2) = CONCAT44((float)iStack_12c * fVar1,(float)iStack_130 * fVar1);
            *(ulong *)(_cblk_h + 4) = CONCAT44((float)iStack_144 * fVar1,(float)local_148 * fVar1);
            *(ulong *)(_cblk_h + 6) = CONCAT44((float)iStack_13c * fVar1,(float)iStack_140 * fVar1);
            *(ulong *)(_cblk_h + 8) = CONCAT44((float)iStack_154 * fVar1,(float)local_158 * fVar1);
            *(ulong *)(_cblk_h + 10) = CONCAT44((float)iStack_14c * fVar1,(float)iStack_150 * fVar1)
            ;
            _cblk_h[0xc] = (float)local_168 * fVar1;
            _cblk_h[0xd] = (float)iStack_164 * fVar1;
            _cblk_h[0xe] = (float)iStack_160 * fVar1;
            _cblk_h[0xf] = (float)iStack_15c * fVar1;
            _cblk_h = _cblk_h + 0x10;
          }
          for (; job._4_4_ < uVar11; job._4_4_ = job._4_4_ + 1) {
            *_cblk_h = (float)(int)*_cblk_h * (float)piVar7[10];
            _cblk_h = _cblk_h + 1;
          }
        }
      }
      opj_free(user_data);
    }
  }
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper);
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if (OPJ_FALSE == opj_t1_decode_cblk(
                t1,
                cblk,
                band->bandno,
                (OPJ_UINT32)tccp->roishift,
                tccp->cblksty,
                job->p_manager,
                job->p_manager_mutex,
                job->check_pterm)) {
        *(job->pret) = OPJ_FALSE;
        opj_free(job);
        return;
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(band->stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * band->stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * band->stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}